

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.h
# Opt level: O2

uint64 GetFileSize(FILE *file)

{
  int iVar1;
  ostream *poVar2;
  uint64 uVar3;
  allocator local_56;
  allocator local_55;
  Logger local_54;
  string local_50;
  string local_30;
  
  if (file != (FILE *)0x0) {
    iVar1 = fseek((FILE *)file,0,2);
    if (iVar1 != 0) {
      local_54.severity_ = FATAL;
      std::__cxx11::string::string
                ((string *)&local_30,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/base/file_util.h"
                 ,&local_55);
      std::__cxx11::string::string((string *)&local_50,"GetFileSize",&local_56);
      poVar2 = Logger::Start(FATAL,&local_30,0x9f,&local_50);
      std::operator<<(poVar2,"Error: invoke fseek().");
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_30);
      Logger::~Logger(&local_54);
    }
    uVar3 = ftell((FILE *)file);
    if (uVar3 == 0xffffffffffffffff) {
      local_54.severity_ = FATAL;
      std::__cxx11::string::string
                ((string *)&local_30,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/base/file_util.h"
                 ,&local_55);
      std::__cxx11::string::string((string *)&local_50,"GetFileSize",&local_56);
      poVar2 = Logger::Start(FATAL,&local_30,0xa4,&local_50);
      std::operator<<(poVar2,"Error: invoke ftell().");
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_30);
      Logger::~Logger(&local_54);
    }
    rewind((FILE *)file);
    return uVar3;
  }
  local_54.severity_ = ERR;
  std::__cxx11::string::string
            ((string *)&local_30,
             "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/base/file_util.h"
             ,&local_55);
  std::__cxx11::string::string((string *)&local_50,"GetFileSize",&local_56);
  poVar2 = Logger::Start(ERR,&local_30,0x9d,&local_50);
  poVar2 = std::operator<<(poVar2,"CHECK failed ");
  poVar2 = std::operator<<(poVar2,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/base/file_util.h"
                          );
  poVar2 = std::operator<<(poVar2,":");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x9d);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"file");
  std::operator<<(poVar2," == NULL \n");
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  Logger::~Logger(&local_54);
  abort();
}

Assistant:

inline uint64 GetFileSize(FILE *file) {
  CHECK_NOTNULL(file);
  if (fseek(file, 0L, SEEK_END) != 0) {
    LOG(FATAL) << "Error: invoke fseek().";
  }
  // Note that we use uint64 here for big file
  uint64 total_size = ftell(file);
  if (total_size == -1) {
    LOG(FATAL) << "Error: invoke ftell().";
  }
  // Return to the head of file
  rewind(file);
  return total_size;
}